

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O1

void __thiscall Timidity::Renderer::Renderer(Renderer *this,float sample_rate,char *args)

{
  Voice *pVVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  
  this->rate = sample_rate;
  this->patches = (DLS_Data *)0x0;
  this->default_instrument = (Instrument *)0x0;
  this->voice = (Voice *)0x0;
  this->adjust_panning_immediately = 0;
  iVar4 = 0xff;
  if ((int)(sample_rate * 0.001) < 0xff) {
    iVar4 = (int)(sample_rate * 0.001);
  }
  iVar2 = 1;
  if (1 < iVar4) {
    iVar2 = iVar4;
  }
  this->control_ratio = iVar2;
  this->lost_notes = 0;
  this->cut_notes = 0;
  this->default_program = 0;
  this->resample_buffer_size = 0;
  this->resample_buffer = (sample_t *)0x0;
  if (*(int *)(def_instr_name + -0xc) != 0) {
    set_default_instrument(this,def_instr_name);
  }
  uVar3 = 0x10;
  if (0x10 < midi_voices.Value) {
    uVar3 = (ulong)(uint)midi_voices.Value;
  }
  this->voices = (int)uVar3;
  pVVar1 = (Voice *)operator_new__(uVar3 * 0x170);
  this->voice = pVVar1;
  this->drumchannels = 0x200;
  return;
}

Assistant:

Renderer::Renderer(float sample_rate, const char *args)
{
	// 'args' should be used to load a custom config or DMXGUS, but since setup currently requires a snd_reset call, this will need some refactoring first
	rate = sample_rate;
	patches = NULL;
	resample_buffer_size = 0;
	resample_buffer = NULL;
	voice = NULL;
	adjust_panning_immediately = false;

	control_ratio = clamp(int(rate / CONTROLS_PER_SECOND), 1, MAX_CONTROL_RATIO);

	lost_notes = 0;
	cut_notes = 0;

	default_instrument = NULL;
	default_program = DEFAULT_PROGRAM;
	if (def_instr_name.IsNotEmpty())
		set_default_instrument(def_instr_name);

	voices = MAX(*midi_voices, 16);
	voice = new Voice[voices];
	drumchannels = DEFAULT_DRUMCHANNELS;
#if 0
	FILE *f = fopen("c:\\windows\\system32\\drivers\\gm.dls", "rb");
	patches = LoadDLS(f);
	fclose(f);
#endif
}